

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,int iCursor)

{
  int iVar1;
  Expr *pEVar2;
  undefined1 local_68 [8];
  SubstContext x;
  Select *pX;
  int nChng;
  Expr *pNew;
  Expr *pEStack_28;
  int iCursor_local;
  Expr *pWhere_local;
  Select *pSubq_local;
  Parse *pParse_local;
  
  pX._4_4_ = 0;
  x.pEList = (ExprList *)pSubq;
  if (pWhere == (Expr *)0x0) {
    pParse_local._4_4_ = 0;
  }
  else {
    for (; x.pEList != (ExprList *)0x0; x.pEList = *(ExprList **)&x.pEList[1].a[0].sortOrder) {
      if (((ulong)(x.pEList)->a[0].pExpr & 0x200800000000) != 0) {
        return 0;
      }
    }
    pEStack_28 = pWhere;
    if (pSubq->pLimit == (Expr *)0x0) {
      for (; pEStack_28->op == 'G'; pEStack_28 = pEStack_28->pLeft) {
        iVar1 = pushDownWhereTerms(pParse,pSubq,pEStack_28->pRight,iCursor);
        pX._4_4_ = iVar1 + pX._4_4_;
      }
      if ((pEStack_28->flags & 1) == 0) {
        iVar1 = sqlite3ExprIsTableConstant(pEStack_28,iCursor);
        if (iVar1 != 0) {
          pX._4_4_ = pX._4_4_ + 1;
          for (pWhere_local = (Expr *)pSubq; pWhere_local != (Expr *)0x0;
              pWhere_local = *(Expr **)(pWhere_local + 1)) {
            pEVar2 = sqlite3ExprDup(pParse->db,pEStack_28,0);
            x.iTable = 0;
            x._16_8_ = *(undefined8 *)pWhere_local;
            local_68 = (undefined1  [8])pParse;
            x.pParse._0_4_ = iCursor;
            x.pParse._4_4_ = iCursor;
            pEVar2 = substExpr((SubstContext *)local_68,pEVar2);
            pEVar2 = sqlite3ExprAnd(pParse->db,*(Expr **)&pWhere_local->nHeight,pEVar2);
            *(Expr **)&pWhere_local->nHeight = pEVar2;
          }
        }
        pParse_local._4_4_ = pX._4_4_;
      }
      else {
        pParse_local._4_4_ = 0;
      }
    }
    else {
      pParse_local._4_4_ = 0;
    }
  }
  return pParse_local._4_4_;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  int iCursor           /* Cursor number of the subquery */
){
  Expr *pNew;
  int nChng = 0;
  Select *pX;           /* For looping over compound SELECTs in pSubq */
  if( pWhere==0 ) return 0;
  for(pX=pSubq; pX; pX=pX->pPrior){
    if( (pX->selFlags & (SF_Aggregate|SF_Recursive))!=0 ){
      testcase( pX->selFlags & SF_Aggregate );
      testcase( pX->selFlags & SF_Recursive );
      testcase( pX!=pSubq );
      return 0; /* restrictions (1) and (2) */
    }
  }
  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, iCursor);
    pWhere = pWhere->pLeft;
  }
  if( ExprHasProperty(pWhere,EP_FromJoin) ) return 0; /* restriction 5 */
  if( sqlite3ExprIsTableConstant(pWhere, iCursor) ){
    nChng++;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      x.pParse = pParse;
      x.iTable = iCursor;
      x.iNewTable = iCursor;
      x.isLeftJoin = 0;
      x.pEList = pSubq->pEList;
      pNew = substExpr(&x, pNew);
      pSubq->pWhere = sqlite3ExprAnd(pParse->db, pSubq->pWhere, pNew);
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}